

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmLinkInterface * __thiscall
cmGeneratorTarget::GetImportLinkInterface
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *headTarget,
          bool usage_requirements_only)

{
  _Base_ptr p_Var1;
  ImportInfo *pIVar2;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *this_00;
  mapped_type *items;
  cmGeneratorTarget *headTarget_local;
  cmListFileBacktrace local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  string CONFIG;
  
  headTarget_local = headTarget;
  pIVar2 = GetImportInfo(this,config);
  if (pIVar2 == (ImportInfo *)0x0) {
    items = (mapped_type *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&CONFIG,config);
    if (usage_requirements_only) {
      this_00 = &GetHeadToLinkInterfaceUsageRequirementsMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    else {
      this_00 = &GetHeadToLinkInterfaceMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       *(char *)((long)&p_Var1[4]._M_left + 4) != '\0')) {
      items = std::
              map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
              ::operator[](this_00,&headTarget_local);
      if ((items->super_cmLinkInterface).field_0x6a == '\0') {
        (items->super_cmLinkInterface).field_0x6a = 1;
        (items->super_cmLinkInterface).Multiplicity = pIVar2->Multiplicity;
        cmSystemTools::ExpandListArgument
                  (&pIVar2->Languages,&(items->super_cmLinkInterface).Languages,false);
        ExpandLinkItems(this,&pIVar2->LibrariesProp,&pIVar2->Libraries,config,headTarget_local,
                        usage_requirements_only,
                        (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)items,
                        (bool *)&(items->super_cmLinkInterface).field_0x6c);
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&pIVar2->SharedDeps,&deps,false);
        local_78.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        LookupLinkItems(this,&deps,&local_78,&(items->super_cmLinkInterface).SharedDeps);
        if (local_78.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&deps);
      }
    }
    else {
      items = (mapped_type *)&p_Var1[1]._M_parent;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONFIG._M_dataplus._M_p != &CONFIG.field_2) {
      operator_delete(CONFIG._M_dataplus._M_p,CONFIG.field_2._M_allocated_capacity + 1);
    }
  }
  return &items->super_cmLinkInterface;
}

Assistant:

const cmLinkInterface* cmGeneratorTarget::GetImportLinkInterface(
  const std::string& config, cmGeneratorTarget const* headTarget,
  bool usage_requirements_only) const
{
  cmGeneratorTarget::ImportInfo const* info = this->GetImportInfo(config);
  if (!info) {
    return nullptr;
  }

  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmHeadToLinkInterfaceMap& hm =
    (usage_requirements_only
       ? this->GetHeadToLinkInterfaceUsageRequirementsMap(config)
       : this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    return &hm.begin()->second;
  }

  cmOptionalLinkInterface& iface = hm[headTarget];
  if (!iface.AllDone) {
    iface.AllDone = true;
    iface.Multiplicity = info->Multiplicity;
    cmSystemTools::ExpandListArgument(info->Languages, iface.Languages);
    this->ExpandLinkItems(info->LibrariesProp, info->Libraries, config,
                          headTarget, usage_requirements_only, iface.Libraries,
                          iface.HadHeadSensitiveCondition);
    std::vector<std::string> deps;
    cmSystemTools::ExpandListArgument(info->SharedDeps, deps);
    this->LookupLinkItems(deps, cmListFileBacktrace(), iface.SharedDeps);
  }

  return &iface;
}